

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_int16 *
ma_dr_wav_open_file_and_read_pcm_frames_s16_w
          (wchar_t *filename,uint *channelsOut,uint *sampleRateOut,ma_uint64 *totalFrameCountOut,
          ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_bool32 mVar1;
  ma_int16 *pmVar2;
  ma_dr_wav wav;
  ma_dr_wav local_1b0;
  
  if (sampleRateOut != (uint *)0x0) {
    *sampleRateOut = 0;
  }
  if (channelsOut != (uint *)0x0) {
    *channelsOut = 0;
  }
  if (totalFrameCountOut != (ma_uint64 *)0x0) {
    *totalFrameCountOut = 0;
  }
  pmVar2 = (ma_int16 *)0x0;
  mVar1 = ma_dr_wav_init_file_ex_w
                    (&local_1b0,filename,(ma_dr_wav_chunk_proc)0x0,(void *)0x0,0,
                     pAllocationCallbacks);
  if (mVar1 != 0) {
    pmVar2 = ma_dr_wav__read_pcm_frames_and_close_s16
                       (&local_1b0,channelsOut,sampleRateOut,totalFrameCountOut);
  }
  return pmVar2;
}

Assistant:

MA_API ma_int16* ma_dr_wav_open_file_and_read_pcm_frames_s16_w(const wchar_t* filename, unsigned int* channelsOut, unsigned int* sampleRateOut, ma_uint64* totalFrameCountOut, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_wav wav;
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (channelsOut) {
        *channelsOut = 0;
    }
    if (totalFrameCountOut) {
        *totalFrameCountOut = 0;
    }
    if (!ma_dr_wav_init_file_w(&wav, filename, pAllocationCallbacks)) {
        return NULL;
    }
    return ma_dr_wav__read_pcm_frames_and_close_s16(&wav, channelsOut, sampleRateOut, totalFrameCountOut);
}